

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  bool bVar2;
  undefined1 *puVar3;
  assertion_failure *this_00;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ptrdiff_t _Num;
  size_t __n;
  undefined1 local_25 [13];
  
  iVar1 = *(int *)(this + 4);
  __n = (size_t)iVar1;
  if ((long)__n < 0) {
    this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this_00,"invalid digit count");
    __cxa_throw(this_00,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  uVar6 = *(uint *)this;
  puVar3 = local_25 + __n;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar7 % 100) * 2);
      puVar3 = puVar3 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar7 / 100;
    } while (bVar2);
  }
  __dest = *it;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar4 = -1;
  }
  else {
    puVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[(ulong)uVar6 * 2];
    lVar4 = -2;
  }
  puVar3[lVar4] = bVar5;
  if (iVar1 != 0) {
    memcpy(__dest,local_25,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }